

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleTable::cellAt(QAccessibleTable *this,int row,int column)

{
  int iVar1;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar2;
  QAccessibleInterface *pQVar3;
  QDebug *pQVar4;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QModelIndex local_a0;
  char *local_88;
  QDebug local_80;
  Stream *local_78;
  undefined1 local_70 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemView *)view(this);
  pQVar2 = QAbstractItemView::model(this_00);
  if (pQVar2 != (QAbstractItemModel *)0x0) {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex(&local_a0,this_00);
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_58,pQVar2,row,column,&local_a0,in_R9,this_00);
    if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
       (local_48.ptr != (QAbstractItemModel *)0x0)) {
      iVar1 = logicalIndex(this,(QModelIndex *)&local_58);
      pQVar3 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar1);
      goto LAB_004d97bd;
    }
    local_a0.r = 2;
    local_a0.m.ptr._4_4_ = 0;
    local_a0._4_8_ = 0;
    local_a0._12_8_ = 0;
    local_88 = "default";
    QMessageLogger::warning();
    pQVar4 = QDebug::operator<<(&local_80,"QAccessibleTable::cellAt: invalid index: ");
    local_78 = pQVar4->stream;
    *(int *)(local_78 + 0x28) = *(int *)(local_78 + 0x28) + 1;
    ::operator<<((Stream *)local_70,(QModelIndex *)&local_78);
    pQVar4 = QDebug::operator<<((QDebug *)local_70," for ");
    local_68.ptr = (QAbstractItemModel *)pQVar4->stream;
    *(int *)((Stream *)local_68.ptr + 0x28) = *(int *)((Stream *)local_68.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_60,(QWidget *)&local_68);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug(&local_80);
  }
  pQVar3 = (QAccessibleInterface *)0x0;
LAB_004d97bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::cellAt(int row, int column) const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;
    Q_ASSERT(role() != QAccessible::List);
    Q_ASSERT(role() != QAccessible::Tree);
    QModelIndex index = theModel->index(row, column, theView->rootIndex());
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning() << "QAccessibleTable::cellAt: invalid index: " << index << " for " << theView;
        return nullptr;
    }
    return child(logicalIndex(index));
}